

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O1

UnicodeString * __thiscall icu_63::CalendarAstronomer::Equatorial::toString(Equatorial *this)

{
  UnicodeString *in_RDI;
  
  (in_RDI->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b5258;
  (in_RDI->fUnion).fStackFields.fLengthAndFlags = 2;
  return in_RDI;
}

Assistant:

UnicodeString CalendarAstronomer::Equatorial::toString() const
{
#ifdef U_DEBUG_ASTRO
    char tmp[400];
    sprintf(tmp, "%f,%f",
        (ascension*RAD_DEG), (declination*RAD_DEG));
    return UnicodeString(tmp, "");
#else
    return UnicodeString();
#endif
}